

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestCaseForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *pTVar1;
  TestResult *pTVar2;
  ostream *poVar3;
  internal *piVar4;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t width_01;
  TimeInMillis ms;
  size_t width_02;
  TimeInMillis ms_00;
  size_t width_03;
  size_t width_04;
  size_t width_05;
  string local_408;
  string local_3e8;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  string local_38;
  TestResult *local_18;
  TestResult *result_local;
  ostream *stream_local;
  
  local_18 = result;
  result_local = (TestResult *)stream;
  Indent_abi_cxx11_(&local_38,(internal *)0x8,in_RDX);
  poVar3 = std::operator<<(stream,(string *)&local_38);
  std::operator<<(poVar3,"{\n");
  std::__cxx11::string::~string((string *)&local_38);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"testcase",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  Indent_abi_cxx11_(&local_e0,(internal *)0xa,width);
  OutputJsonKey((ostream *)pTVar1,&local_68,&local_90,&local_b8,&local_e0,true);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"testcase",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"status",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"RUN",&local_151);
  Indent_abi_cxx11_(&local_178,(internal *)0xa,width_00);
  OutputJsonKey((ostream *)pTVar1,&local_100,&local_128,&local_150,&local_178,true);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"testcase",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"result",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"COMPLETED",&local_1e9);
  Indent_abi_cxx11_(&local_210,(internal *)0xa,width_01);
  OutputJsonKey((ostream *)pTVar1,&local_198,&local_1c0,&local_1e8,&local_210,true);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"testcase",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"timestamp",&local_259);
  piVar4 = (internal *)TestResult::start_timestamp(local_18);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_280,piVar4,ms);
  Indent_abi_cxx11_(&local_2a0,(internal *)0xa,width_02);
  OutputJsonKey((ostream *)pTVar1,&local_230,&local_258,&local_280,&local_2a0,true);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"testcase",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"time",&local_2e9);
  piVar4 = (internal *)TestResult::elapsed_time(local_18);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_310,piVar4,ms_00);
  Indent_abi_cxx11_(&local_330,(internal *)0xa,width_03);
  OutputJsonKey((ostream *)pTVar1,&local_2c0,&local_2e8,&local_310,&local_330,true);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"testcase",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"classname",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"",&local_3a1);
  Indent_abi_cxx11_(&local_3c8,(internal *)0xa,width_04);
  OutputJsonKey((ostream *)pTVar1,&local_350,&local_378,&local_3a0,&local_3c8,false);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  pTVar2 = result_local;
  pTVar1 = local_18;
  Indent_abi_cxx11_(&local_408,(internal *)0xa,width_05);
  TestPropertiesAsJson(&local_3e8,pTVar1,&local_408);
  std::operator<<((ostream *)pTVar2,(string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  OutputJsonTestResult((ostream *)result_local,local_18);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestCaseForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);
}